

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::Reference>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Reference *__first;
  Reference *__last;
  StreamReader *pSVar2;
  bool bVar3;
  char cVar4;
  ulong uVar5;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  int iVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  bool triple_deliminated;
  char nc;
  char c;
  bool local_1c1;
  undefined4 local_1c0;
  undefined4 local_1bc;
  Reference local_1b8;
  string local_68;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_1bc = (undefined4)CONCAT71(in_register_00000011,end_symbol);
  __first = (result->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
            _M_impl.super__Vector_impl_data._M_start;
  __last = (result->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__last != __first) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Reference*>(__first,__last);
    (result->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>)._M_impl.
    super__Vector_impl_data._M_finish = __first;
  }
  local_1c0 = (undefined4)CONCAT71(in_register_00000031,sep);
  bVar3 = SkipWhitespaceAndNewline(this,true);
  if (bVar3) {
    local_1b8.asset_path.asset_path_._M_dataplus._M_p =
         (pointer)&local_1b8.asset_path.asset_path_.field_2;
    local_1b8.asset_path.asset_path_._M_string_length = 0;
    local_1b8.asset_path.asset_path_.field_2._M_local_buf[0] = '\0';
    local_1b8.asset_path.resolved_path_._M_dataplus._M_p =
         (pointer)&local_1b8.asset_path.resolved_path_.field_2;
    local_1b8.asset_path.resolved_path_._M_string_length = 0;
    local_1b8.asset_path.resolved_path_.field_2._M_local_buf[0] = '\0';
    local_1b8.prim_path._prim_part._M_dataplus._M_p =
         (pointer)&local_1b8.prim_path._prim_part.field_2;
    local_1b8.prim_path._prim_part._M_string_length = 0;
    local_1b8.prim_path._prim_part.field_2._M_local_buf[0] = '\0';
    local_1b8.prim_path._prop_part._M_dataplus._M_p =
         (pointer)&local_1b8.prim_path._prop_part.field_2;
    local_1b8.prim_path._prop_part._M_string_length = 0;
    local_1b8.prim_path._prop_part.field_2._M_local_buf[0] = '\0';
    local_1b8.prim_path._variant_part._M_dataplus._M_p =
         (pointer)&local_1b8.prim_path._variant_part.field_2;
    local_1b8.prim_path._variant_part._M_string_length = 0;
    local_1b8.prim_path._variant_part.field_2._M_local_buf[0] = '\0';
    local_1b8.prim_path._variant_selection_part._M_dataplus._M_p =
         (pointer)&local_1b8.prim_path._variant_selection_part.field_2;
    local_1b8.prim_path._variant_selection_part._M_string_length = 0;
    local_1b8.prim_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
    local_1b8.prim_path._variant_part_str._M_dataplus._M_p =
         (pointer)&local_1b8.prim_path._variant_part_str.field_2;
    local_1b8.prim_path._variant_part_str._M_string_length = 0;
    local_1b8.prim_path._variant_part_str.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_1b8.prim_path._element.field_2;
    local_1b8.prim_path._element._M_string_length = 0;
    local_1b8.prim_path._element.field_2._M_local_buf[0] = '\0';
    local_1b8.prim_path._path_type.has_value_ = false;
    local_1b8.prim_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    local_1b8.prim_path._valid = false;
    local_1b8.layerOffset._offset = 0.0;
    local_1b8.layerOffset._scale = 1.0;
    local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1c1 = false;
    local_1b8.prim_path._element._M_dataplus._M_p = (pointer)paVar1;
    local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar3 = ParseReference(this,&local_1b8,&local_1c1);
    if (bVar3) {
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::push_back
                (result,&local_1b8);
    }
    else {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Failed to parse Reference.\n","");
      PushError(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    paVar7 = &local_1b8.asset_path.asset_path_.field_2;
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::_M_erase(&local_1b8.customData._M_t,
               (_Link_type)
               local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.prim_path._element._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8.prim_path._element._M_dataplus._M_p,
                      CONCAT71(local_1b8.prim_path._element.field_2._M_allocated_capacity._1_7_,
                               local_1b8.prim_path._element.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.prim_path._variant_part_str._M_dataplus._M_p !=
        &local_1b8.prim_path._variant_part_str.field_2) {
      operator_delete(local_1b8.prim_path._variant_part_str._M_dataplus._M_p,
                      CONCAT71(local_1b8.prim_path._variant_part_str.field_2._M_allocated_capacity.
                               _1_7_,local_1b8.prim_path._variant_part_str.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.prim_path._variant_selection_part._M_dataplus._M_p !=
        &local_1b8.prim_path._variant_selection_part.field_2) {
      operator_delete(local_1b8.prim_path._variant_selection_part._M_dataplus._M_p,
                      CONCAT71(local_1b8.prim_path._variant_selection_part.field_2.
                               _M_allocated_capacity._1_7_,
                               local_1b8.prim_path._variant_selection_part.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.prim_path._variant_part._M_dataplus._M_p !=
        &local_1b8.prim_path._variant_part.field_2) {
      operator_delete(local_1b8.prim_path._variant_part._M_dataplus._M_p,
                      CONCAT71(local_1b8.prim_path._variant_part.field_2._M_allocated_capacity._1_7_
                               ,local_1b8.prim_path._variant_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.prim_path._prop_part._M_dataplus._M_p !=
        &local_1b8.prim_path._prop_part.field_2) {
      operator_delete(local_1b8.prim_path._prop_part._M_dataplus._M_p,
                      CONCAT71(local_1b8.prim_path._prop_part.field_2._M_allocated_capacity._1_7_,
                               local_1b8.prim_path._prop_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.prim_path._prim_part._M_dataplus._M_p !=
        &local_1b8.prim_path._prim_part.field_2) {
      operator_delete(local_1b8.prim_path._prim_part._M_dataplus._M_p,
                      CONCAT71(local_1b8.prim_path._prim_part.field_2._M_allocated_capacity._1_7_,
                               local_1b8.prim_path._prim_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.asset_path.resolved_path_._M_dataplus._M_p !=
        &local_1b8.asset_path.resolved_path_.field_2) {
      operator_delete(local_1b8.asset_path.resolved_path_._M_dataplus._M_p,
                      CONCAT71(local_1b8.asset_path.resolved_path_.field_2._M_allocated_capacity.
                               _1_7_,local_1b8.asset_path.resolved_path_.field_2._M_local_buf[0]) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.asset_path.asset_path_._M_dataplus._M_p != paVar7) {
      operator_delete(local_1b8.asset_path.asset_path_._M_dataplus._M_p,
                      CONCAT71(local_1b8.asset_path.asset_path_.field_2._M_allocated_capacity._1_7_,
                               local_1b8.asset_path.asset_path_.field_2._M_local_buf[0]) + 1);
    }
    if (bVar3) {
      local_48 = 0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0x3ff00000;
      do {
        pSVar2 = this->_sr;
        if ((pSVar2->length_ <= pSVar2->idx_) || (pSVar2->binary_[pSVar2->idx_] == '\0'))
        goto LAB_003ab29b;
        bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar3) {
          return false;
        }
        bVar3 = Char1(this,(char *)&local_68);
        cVar4 = (char)local_1c0;
        if (!bVar3) {
          return false;
        }
        if ((char)local_68._M_dataplus._M_p == cVar4) {
          bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar3) {
            return false;
          }
          bVar3 = LookChar1(this,(char *)&local_1b8);
          if (!bVar3) {
            return false;
          }
          iVar6 = 3;
          if ((char)local_1b8.asset_path.asset_path_._M_dataplus._M_p != (char)local_1bc) {
            cVar4 = (char)local_1c0;
            goto LAB_003aaff0;
          }
        }
        else {
LAB_003aaff0:
          if ((char)local_68._M_dataplus._M_p != cVar4) {
            pSVar2 = this->_sr;
            if ((0 < (long)pSVar2->idx_) && (uVar5 = pSVar2->idx_ - 1, uVar5 <= pSVar2->length_)) {
              pSVar2->idx_ = uVar5;
            }
            goto LAB_003ab29b;
          }
          bVar3 = SkipWhitespaceAndNewline(this,true);
          if (!bVar3) {
            return false;
          }
          local_1b8.asset_path.asset_path_._M_string_length = 0;
          local_1b8.asset_path.asset_path_.field_2._M_local_buf[0] = '\0';
          local_1b8.asset_path.resolved_path_._M_dataplus._M_p =
               (pointer)&local_1b8.asset_path.resolved_path_.field_2;
          local_1b8.asset_path.resolved_path_._M_string_length = 0;
          local_1b8.asset_path.resolved_path_.field_2._M_local_buf[0] = '\0';
          local_1b8.prim_path._prim_part._M_dataplus._M_p =
               (pointer)&local_1b8.prim_path._prim_part.field_2;
          local_1b8.prim_path._prim_part._M_string_length = 0;
          local_1b8.prim_path._prim_part.field_2._M_local_buf[0] = '\0';
          local_1b8.prim_path._prop_part._M_dataplus._M_p =
               (pointer)&local_1b8.prim_path._prop_part.field_2;
          local_1b8.prim_path._prop_part._M_string_length = 0;
          local_1b8.prim_path._prop_part.field_2._M_local_buf[0] = '\0';
          local_1b8.prim_path._variant_part._M_dataplus._M_p =
               (pointer)&local_1b8.prim_path._variant_part.field_2;
          local_1b8.prim_path._variant_part._M_string_length = 0;
          local_1b8.prim_path._variant_part.field_2._M_local_buf[0] = '\0';
          local_1b8.prim_path._variant_selection_part._M_dataplus._M_p =
               (pointer)&local_1b8.prim_path._variant_selection_part.field_2;
          local_1b8.prim_path._variant_selection_part._M_string_length = 0;
          local_1b8.prim_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
          local_1b8.prim_path._variant_part_str._M_dataplus._M_p =
               (pointer)&local_1b8.prim_path._variant_part_str.field_2;
          local_1b8.prim_path._variant_part_str._M_string_length = 0;
          local_1b8.prim_path._variant_part_str.field_2._M_local_buf[0] = '\0';
          local_1b8.prim_path._element._M_string_length = 0;
          local_1b8.prim_path._element.field_2._M_local_buf[0] = '\0';
          local_1b8.prim_path._path_type.has_value_ = false;
          local_1b8.prim_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
          local_1b8.prim_path._valid = false;
          local_1b8.layerOffset._offset = (double)CONCAT44(uStack_44,local_48);
          local_1b8.layerOffset._scale = (double)CONCAT44(uStack_3c,uStack_40);
          local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_header;
          local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1c1 = false;
          local_1b8.asset_path.asset_path_._M_dataplus._M_p = (pointer)paVar7;
          local_1b8.prim_path._element._M_dataplus._M_p = (pointer)paVar1;
          local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar3 = ParseReference(this,&local_1b8,&local_1c1);
          iVar6 = 3;
          if (bVar3) {
            ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::push_back
                      (result,&local_1b8);
            iVar6 = 0;
          }
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          ::_M_erase(&local_1b8.customData._M_t,
                     (_Link_type)
                     local_1b8.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.prim_path._element._M_dataplus._M_p != paVar1) {
            operator_delete(local_1b8.prim_path._element._M_dataplus._M_p,
                            CONCAT71(local_1b8.prim_path._element.field_2._M_allocated_capacity.
                                     _1_7_,local_1b8.prim_path._element.field_2._M_local_buf[0]) + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.prim_path._variant_part_str._M_dataplus._M_p !=
              &local_1b8.prim_path._variant_part_str.field_2) {
            operator_delete(local_1b8.prim_path._variant_part_str._M_dataplus._M_p,
                            CONCAT71(local_1b8.prim_path._variant_part_str.field_2.
                                     _M_allocated_capacity._1_7_,
                                     local_1b8.prim_path._variant_part_str.field_2._M_local_buf[0])
                            + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.prim_path._variant_selection_part._M_dataplus._M_p !=
              &local_1b8.prim_path._variant_selection_part.field_2) {
            operator_delete(local_1b8.prim_path._variant_selection_part._M_dataplus._M_p,
                            CONCAT71(local_1b8.prim_path._variant_selection_part.field_2.
                                     _M_allocated_capacity._1_7_,
                                     local_1b8.prim_path._variant_selection_part.field_2.
                                     _M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.prim_path._variant_part._M_dataplus._M_p !=
              &local_1b8.prim_path._variant_part.field_2) {
            operator_delete(local_1b8.prim_path._variant_part._M_dataplus._M_p,
                            CONCAT71(local_1b8.prim_path._variant_part.field_2._M_allocated_capacity
                                     ._1_7_,local_1b8.prim_path._variant_part.field_2._M_local_buf
                                            [0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.prim_path._prop_part._M_dataplus._M_p !=
              &local_1b8.prim_path._prop_part.field_2) {
            operator_delete(local_1b8.prim_path._prop_part._M_dataplus._M_p,
                            CONCAT71(local_1b8.prim_path._prop_part.field_2._M_allocated_capacity.
                                     _1_7_,local_1b8.prim_path._prop_part.field_2._M_local_buf[0]) +
                            1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.prim_path._prim_part._M_dataplus._M_p !=
              &local_1b8.prim_path._prim_part.field_2) {
            operator_delete(local_1b8.prim_path._prim_part._M_dataplus._M_p,
                            CONCAT71(local_1b8.prim_path._prim_part.field_2._M_allocated_capacity.
                                     _1_7_,local_1b8.prim_path._prim_part.field_2._M_local_buf[0]) +
                            1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.asset_path.resolved_path_._M_dataplus._M_p !=
              &local_1b8.asset_path.resolved_path_.field_2) {
            operator_delete(local_1b8.asset_path.resolved_path_._M_dataplus._M_p,
                            CONCAT71(local_1b8.asset_path.resolved_path_.field_2.
                                     _M_allocated_capacity._1_7_,
                                     local_1b8.asset_path.resolved_path_.field_2._M_local_buf[0]) +
                            1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.asset_path.asset_path_._M_dataplus._M_p != paVar7) {
            operator_delete(local_1b8.asset_path.asset_path_._M_dataplus._M_p,
                            CONCAT71(local_1b8.asset_path.asset_path_.field_2._M_allocated_capacity.
                                     _1_7_,local_1b8.asset_path.asset_path_.field_2._M_local_buf[0])
                            + 1);
          }
        }
      } while (iVar6 == 0);
      if (iVar6 != 1) {
LAB_003ab29b:
        if ((result->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
            _M_impl.super__Vector_impl_data._M_start !=
            (result->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_1b8.asset_path.asset_path_._M_dataplus._M_p = (pointer)paVar7;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"Empty array.\n","");
        PushError(this,(string *)&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8.asset_path.asset_path_._M_dataplus._M_p != paVar7) {
          operator_delete(local_1b8.asset_path.asset_path_._M_dataplus._M_p,
                          CONCAT71(local_1b8.asset_path.asset_path_.field_2._M_allocated_capacity.
                                   _1_7_,local_1b8.asset_path.asset_path_.field_2._M_local_buf[0]) +
                          1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep,
                                  const char end_symbol,
                                  std::vector<Reference> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    Reference ref;
    bool triple_deliminated{false};

    if (!ParseReference(&ref, &triple_deliminated)) {
      PushError("Failed to parse Reference.\n");
      return false;
    }

    (void)triple_deliminated;

    result->push_back(ref);
  }

  while (!Eof()) {
    // sep
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    Reference ref;
    bool triple_deliminated{false};
    if (!ParseReference(&ref, &triple_deliminated)) {
      break;
    }

    (void)triple_deliminated;
    result->push_back(ref);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}